

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp.hpp
# Opt level: O3

void lcp_from_sa<unsigned_long>
               (string *S,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *ISA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP)

{
  long lVar1;
  size_type __new_size;
  pointer puVar2;
  pointer pcVar3;
  unsigned_long uVar4;
  long lVar5;
  pointer puVar6;
  ulong uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  size_type sVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  
  lVar5 = (long)(SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = S->_M_string_length;
  if (__new_size != lVar5 >> 3) {
    __assert_fail("S.size() == SA.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/lcp.hpp"
                  ,0x2f,
                  "void lcp_from_sa(const std::string &, const std::vector<index_t> &, const std::vector<index_t> &, std::vector<index_t> &) [index_t = unsigned long]"
                 );
  }
  if (lVar5 != (long)(ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("SA.size() == ISA.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/lcp.hpp"
                  ,0x30,
                  "void lcp_from_sa(const std::string &, const std::vector<index_t> &, const std::vector<index_t> &, std::vector<index_t> &) [index_t = unsigned long]"
                 );
  }
  puVar6 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar6 >> 3 != __new_size) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(LCP,__new_size);
    puVar6 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  *puVar6 = 0;
  sVar10 = S->_M_string_length;
  if (sVar10 != 0) {
    puVar2 = (ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    uVar7 = 0;
    uVar8 = 0;
    do {
      uVar9 = 0;
      if (uVar8 != 0) {
        uVar9 = uVar8 - 1;
      }
      uVar11 = puVar2[uVar7];
      uVar8 = uVar9;
      if (uVar9 + uVar7 < sVar10) {
        pcVar3 = (S->_M_dataplus)._M_p;
        uVar12 = uVar9;
        while (uVar11 != 0) {
          uVar4 = (SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar11 - 1];
          uVar8 = uVar12;
          if (((sVar10 <= uVar12 + uVar4) || (pcVar3[uVar12 + uVar7] != pcVar3[uVar12 + uVar4])) ||
             (lVar1 = uVar7 + uVar12, uVar12 = uVar12 + 1, uVar8 = sVar10 + lVar5,
             sVar10 <= lVar1 + 1U)) goto LAB_00139311;
        }
        uVar11 = 0;
        uVar8 = uVar9;
      }
LAB_00139311:
      puVar6[uVar11] = uVar8;
      uVar7 = uVar7 + 1;
      sVar10 = S->_M_string_length;
      lVar5 = lVar5 + -1;
    } while (uVar7 < sVar10);
  }
  return;
}

Assistant:

void lcp_from_sa(const std::string& S, const std::vector<index_t>& SA, const std::vector<index_t>& ISA, std::vector<index_t>& LCP) {
    // TODO: cite the source for this linear O(n) algorithm!

    // input sizes must be equal
    assert(S.size() == SA.size());
    assert(SA.size() == ISA.size());

    // init LCP array if not yet of correct size
    if (LCP.size() != S.size()) {
        LCP.resize(S.size());
    }

    // first LCP is undefined -> set to 0:
    LCP[0] = 0;

    std::size_t h = 0;

    // in string order!
    for (std::size_t i = 0; i < S.size(); ++i) {
        // length of currently equal characters (in string order, next LCP value
        // is always >= current lcp - 1)
        std::size_t k = 0;
        if (h > 0)
            k = h-1;
        // comparing suffix starting from i=SA[ISA[i]] with the previous
        // suffix in SA order: SA[ISA[i]-1]
        while (i+k < S.size() && ISA[i] > 0 && SA[ISA[i]-1]+k < S.size() && S[i+k] == S[SA[ISA[i]-1]+k])
            k++;
        LCP[ISA[i]] = k;
        h = k;
    }
}